

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Company *company)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"budget: ",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,company->budget);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," boss: ",7);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = Boss::getNumberOfEmployee(company->boss);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," employee: ",0xb);
      poVar2 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      lVar3 = lVar3 + 1;
      iVar1 = Boss::getNumberOfEmployee(company->boss);
    } while (lVar3 < iVar1);
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    os << "budget: " << company.budget << " boss: " << company.boss << endl;
    for (int i = 0; i < company.boss->getNumberOfEmployee(); ++i) {
        os << " employee: " << company.employee[i] << "\t";
    }
    return os;
}